

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.hpp
# Opt level: O0

int ixy::IxgbeDevice::init(EVP_PKEY_CTX *ctx)

{
  pointer *this;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin_00;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> begin_01;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> begin_02;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>_>
  begin_03;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>_>
  begin_04;
  pointer len_00;
  __uid_t _Var1;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *value;
  ushort in_CX;
  ushort in_DX;
  string *in_RSI;
  pair<unsigned_char_*,_unsigned_long> pVar2;
  undefined8 in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> local_248;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> local_230;
  string local_218;
  undefined1 local_1f8 [8];
  IxgbeDevice dev;
  unsigned_long len;
  uchar *addr;
  pair<unsigned_char_*,_unsigned_long> mapped_region;
  undefined1 local_158 [8];
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> tx_queues;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> rx_queues;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_110;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>_>
  local_f8;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
  local_d8;
  undefined1 local_a9 [9];
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_a0;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_98;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>_>
  local_80;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
  local_60;
  undefined1 local_31;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_30;
  ushort local_1c;
  ushort local_1a;
  uint16_t num_tx_queues_local;
  string *psStack_18;
  uint16_t num_rx_queues_local;
  string *pci_addr_local;
  
  local_1c = in_CX;
  local_1a = in_DX;
  psStack_18 = in_RSI;
  pci_addr_local = (string *)ctx;
  _Var1 = getuid();
  if (_Var1 != 0) {
    memset(&local_31,0,1);
    local_30.list.second = (char *)ixy::operator<<("not running as root, this will probably fail");
    warn<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x2e,"init",&local_30);
  }
  if (0x40 < local_1a) {
    memset(local_a9,0,1);
    local_a0 = ixy::operator<<("cannot configure ");
    begin.list.second = in_stack_fffffffffffffd60;
    begin.list._0_8_ = in_stack_fffffffffffffd58;
    ixy::operator<<(&local_98,begin,(unsigned_short *)local_a0);
    begin_01.list.first.second = local_98.list.first.second;
    begin_01.list.first._0_8_ = local_98.list.first._0_8_;
    begin_01.list.second = local_98.list.second;
    ixy::operator<<(&local_80,begin_01,(char (*) [22])" rx queues: limit is ");
    begin_03.list.first.first.second = local_80.list.first.first.second;
    begin_03.list.first.first._0_8_ = local_80.list.first.first._0_8_;
    begin_03.list.first.second = local_80.list.first.second;
    begin_03.list.second = local_80.list.second;
    ixy::operator<<(&local_60,begin_03,&MAX_QUEUES);
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x32,"init",&local_60);
    in_stack_fffffffffffffd58 = local_80.list.first.first._0_8_;
    in_stack_fffffffffffffd60 = local_80.list.first.first.second;
  }
  if (0x40 < local_1c) {
    memset((void *)((long)&rx_queues.
                           super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),0,1);
    value = ixy::operator<<("cannot configure ");
    begin_00.list.second = in_stack_fffffffffffffd60;
    begin_00.list._0_8_ = in_stack_fffffffffffffd58;
    ixy::operator<<(&local_110,begin_00,(unsigned_short *)value);
    begin_02.list.first.second = local_110.list.first.second;
    begin_02.list.first._0_8_ = local_110.list.first._0_8_;
    begin_02.list.second = local_110.list.second;
    ixy::operator<<(&local_f8,begin_02,(char (*) [22])" tx queues: limit is ");
    begin_04.list.first.first.second = local_f8.list.first.first.second;
    begin_04.list.first.first._0_8_ = local_f8.list.first.first._0_8_;
    begin_04.list.first.second = local_f8.list.first.second;
    begin_04.list.second = local_f8.list.second;
    ixy::operator<<(&local_d8,begin_04,&MAX_QUEUES);
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x36,"init",&local_d8);
  }
  this = &tx_queues.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::vector
            ((vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> *)this);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::vector
            ((vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> *)local_158);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::reserve
            ((vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> *)this,
             (ulong)local_1a);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::reserve
            ((vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> *)local_158,
             (ulong)local_1c);
  pVar2 = pci_map_resource(psStack_18);
  dev.tx_queues.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar2.second;
  std::__cxx11::string::string((string *)&local_218,(string *)psStack_18);
  len_00 = dev.tx_queues.
           super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::vector
            (&local_230,
             (vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> *)
             &tx_queues.
              super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::vector
            (&local_248,
             (vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> *)local_158);
  IxgbeDevice((IxgbeDevice *)local_1f8,&local_218,pVar2.first,(uint64_t)len_00,local_1a,local_1c,
              &local_230,&local_248);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&local_248);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&local_230);
  std::__cxx11::string::~string((string *)&local_218);
  reset_and_init((IxgbeDevice *)local_1f8);
  std::make_unique<ixy::IxgbeDevice,ixy::IxgbeDevice>((IxgbeDevice *)ctx);
  ~IxgbeDevice((IxgbeDevice *)local_1f8);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector
            ((vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> *)local_158);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector
            ((vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> *)
             &tx_queues.
              super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (int)ctx;
}

Assistant:

static auto
    init(const std::string &pci_addr, uint16_t num_rx_queues,
         uint16_t num_tx_queues) -> std::unique_ptr<IxgbeDevice> {
        if (getuid()) {
            warn("not running as root, this will probably fail");
        }

        if (num_rx_queues > MAX_QUEUES) {
            error("cannot configure " << num_rx_queues << " rx queues: limit is " << MAX_QUEUES);
        }

        if (num_tx_queues > MAX_QUEUES) {
            error("cannot configure " << num_tx_queues << " tx queues: limit is " << MAX_QUEUES);
        }

        std::vector<ixgbe_rx_queue> rx_queues;
        std::vector<ixgbe_tx_queue> tx_queues;

        rx_queues.reserve(num_rx_queues);
        tx_queues.reserve(num_tx_queues);

        auto mapped_region = pci_map_resource(pci_addr);

        auto addr = mapped_region.first;
        auto len = mapped_region.second;

        auto dev = IxgbeDevice{pci_addr, addr, len, num_rx_queues, num_tx_queues, rx_queues, tx_queues};

        dev.reset_and_init();

        return std::make_unique<IxgbeDevice>(std::move(dev));
    }